

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall
testing::Action<unsigned_short_(unsigned_short)>::Perform
          (Action<unsigned_short_(unsigned_short)> *this,ArgumentTuple *args)

{
  bool bVar1;
  int iVar2;
  ActionInterface<unsigned_short_(unsigned_short)> *pAVar3;
  ArgumentTuple *args_local;
  Action<unsigned_short_(unsigned_short)> *this_local;
  
  bVar1 = IsDoDefault(this);
  if (bVar1) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/build_O0/_deps/googletest-src/googlemock/include/gmock/gmock-actions.h"
               ,0x193);
  }
  bVar1 = std::operator!=(&this->fun_,(nullptr_t)0x0);
  if (bVar1) {
    this_local._6_2_ =
         internal::
         Apply<std::function<unsigned_short(unsigned_short)>const&,std::tuple<unsigned_short>>
                   (&this->fun_,args);
  }
  else {
    pAVar3 = internal::linked_ptr<testing::ActionInterface<unsigned_short_(unsigned_short)>_>::
             operator->(&this->impl_);
    iVar2 = (*pAVar3->_vptr_ActionInterface[2])(pAVar3,args);
    this_local._6_2_ = (unsigned_short)iVar2;
  }
  return this_local._6_2_;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
#if GTEST_LANG_CXX11
    if (fun_ != nullptr) {
      return internal::Apply(fun_, ::std::move(args));
    }
#endif
    return impl_->Perform(args);
  }